

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O3

void __thiscall Population::~Population(Population *this)

{
  pointer ppNVar1;
  pointer ppEVar2;
  
  this->_vptr_Population = (_func_int **)&PTR_update_0010f988;
  ppNVar1 = (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar1 != (pointer)0x0) {
    operator_delete(ppNVar1,(long)(this->neurons).
                                  super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppNVar1);
  }
  ppEVar2 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->output).
                                  super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppEVar2);
    return;
  }
  return;
}

Assistant:

virtual ~Population() {}